

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  _GLFWjoystick *p_Var5;
  char *in_RDI;
  uint buttonCount_00;
  int iVar6;
  _GLFWjoystick *js;
  _GLFWjoystickLinux linjs;
  input_id id;
  int hatCount;
  int buttonCount;
  int axisCount;
  char absBits [8];
  char keyBits [96];
  char evBits [4];
  char guid [33];
  char name [256];
  int code;
  int jid;
  int in_stack_ffffffffffffde7c;
  int in_stack_ffffffffffffde84;
  int in_stack_ffffffffffffde8c;
  undefined4 in_stack_ffffffffffffde94;
  int in_stack_ffffffffffffde98;
  undefined4 in_stack_ffffffffffffde9c;
  int local_2128;
  char acStack_2124 [1132];
  int aiStack_1124 [528];
  int aiStack_8e4 [48];
  undefined1 auStack_824 [1568];
  ushort local_204;
  ushort local_202;
  ushort local_200;
  ushort local_1fe;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  char local_1f0 [8];
  char local_1e8 [108];
  byte local_17c [4];
  char local_178 [48];
  char local_148;
  char local_147;
  char local_146;
  char local_145;
  char local_144;
  char local_143;
  char local_142;
  int local_48;
  int local_44;
  char *local_40;
  GLFWbool local_34;
  
  local_40 = in_RDI;
  memset(&local_148,0,0x100);
  memset(local_178,0,0x21);
  memset(local_17c,0,4);
  memset(local_1e8,0,0x60);
  memset(local_1f0,0,8);
  local_1f4 = 0;
  local_1f8 = 0;
  local_1fc = 0;
  memset(&local_2128,0,0x1f24);
  local_44 = 0;
  while( true ) {
    if (0xf < local_44) {
      local_2128 = open(local_40,0x800);
      if (local_2128 == -1) {
        local_34 = 0;
      }
      else {
        iVar1 = ioctl(local_2128,0x80044520,local_17c);
        if ((((iVar1 < 0) || (iVar1 = ioctl(local_2128,0x80604521,local_1e8), iVar1 < 0)) ||
            (iVar1 = ioctl(local_2128,0x80084523,local_1f0), iVar1 < 0)) ||
           (iVar1 = ioctl(local_2128,0x80084502,&local_204), iVar1 < 0)) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar4);
          close(local_2128);
          local_34 = 0;
        }
        else if (((local_17c[0] & 2) == 0) || ((local_17c[0] & 8) == 0)) {
          close(local_2128);
          local_34 = 0;
        }
        else {
          iVar1 = ioctl(local_2128,0x81004506,&local_148);
          if (iVar1 < 0) {
            strncpy(&local_148,"Unknown",0x100);
          }
          if (((local_202 == 0) || (local_200 == 0)) || (local_1fe == 0)) {
            iVar6 = (int)local_145;
            buttonCount_00 = (uint)local_144;
            iVar1 = (int)local_143;
            in_stack_ffffffffffffde98 = (int)local_142;
            sprintf(local_178,"%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                    (ulong)(local_204 & 0xff),(ulong)(uint)((int)(uint)local_204 >> 8),
                    (ulong)(uint)(int)local_148,(ulong)(uint)(int)local_147,(int)local_146);
          }
          else {
            iVar6 = (int)(uint)local_200 >> 8;
            buttonCount_00 = local_1fe & 0xff;
            iVar1 = (int)(uint)local_1fe >> 8;
            sprintf(local_178,"%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                    (ulong)(local_204 & 0xff),(ulong)(uint)((int)(uint)local_204 >> 8),
                    (ulong)(local_202 & 0xff),(ulong)(uint)((int)(uint)local_202 >> 8),
                    local_200 & 0xff);
          }
          for (local_48 = 0x100; local_48 < 0x300; local_48 = local_48 + 1) {
            if (((int)local_1e8[local_48 / 8] & 1 << ((byte)((long)local_48 % 8) & 0x1f)) != 0) {
              aiStack_1124[local_48 + -0x100] = local_1f8;
              local_1f8 = local_1f8 + 1;
            }
          }
          for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 1) {
            aiStack_8e4[(long)local_48 + -0x10] = -1;
            if (((int)local_1f0[local_48 / 8] & 1 << ((byte)((long)local_48 % 8) & 0x1f)) != 0) {
              if ((local_48 < 0x10) || (0x17 < local_48)) {
                iVar2 = ioctl(local_2128,(ulong)(local_48 + 0x40U | 0x80004500) | 0x180000,
                              auStack_824 + (long)local_48 * 0x18);
                if (-1 < iVar2) {
                  aiStack_8e4[(long)local_48 + -0x10] = local_1f4;
                  local_1f4 = local_1f4 + 1;
                }
              }
              else {
                aiStack_8e4[(long)local_48 + -0x10] = local_1fc;
                local_1fc = local_1fc + 1;
                local_48 = local_48 + 1;
              }
            }
          }
          p_Var5 = _glfwAllocJoystick((char *)CONCAT44(in_stack_ffffffffffffde9c,
                                                       in_stack_ffffffffffffde98),
                                      (char *)CONCAT44(in_stack_ffffffffffffde94,iVar1),
                                      in_stack_ffffffffffffde8c,buttonCount_00,
                                      in_stack_ffffffffffffde84);
          if (p_Var5 == (_GLFWjoystick *)0x0) {
            close(local_2128);
            local_34 = 0;
          }
          else {
            strncpy(acStack_2124,local_40,0x1000);
            memcpy(&p_Var5->linjs,&local_2128,0x1f24);
            pollAbsState((_GLFWjoystick *)CONCAT44(in_stack_ffffffffffffde84,iVar6));
            _glfwInputJoystick((_GLFWjoystick *)CONCAT44(in_stack_ffffffffffffde84,iVar6),
                               in_stack_ffffffffffffde7c);
            local_34 = 1;
          }
        }
      }
      return local_34;
    }
    if ((_glfw.joysticks[local_44].present != 0) &&
       (iVar1 = strcmp(_glfw.joysticks[local_44].linjs.path,local_40), iVar1 == 0)) break;
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    int jid, code;
    char name[256] = "";
    char guid[33] = "";
    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    int axisCount = 0, buttonCount = 0, hatCount = 0;
    struct input_id id;
    _GLFWjoystickLinux linjs = {0};
    _GLFWjoystick* js = NULL;

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_KEY, evBits) || !isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    for (code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    js = _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path));
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}